

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

UnblindParameter *
cfd::core::ConfidentialTransaction::CalculateUnblindIssueData
          (UnblindParameter *__return_storage_ptr__,Privkey *blinding_key,ByteData *rangeproof,
          ConfidentialValue *value_commitment,Script *extra,ConfidentialAssetId *asset)

{
  size_type sVar1;
  uchar *puVar2;
  uchar *puVar3;
  size_type sVar4;
  uchar *puVar5;
  Amount AVar6;
  uchar *local_558;
  size_type local_550;
  uchar *local_548;
  size_type local_540;
  uchar *local_538;
  size_type local_530;
  uchar *local_528;
  size_type local_520;
  uchar *local_518;
  size_type local_510;
  int64_t *local_508;
  undefined1 local_4f9;
  int64_t local_4f8;
  CfdException *local_4f0;
  allocator *local_4e8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_4e0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_4d8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_4d0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_4c8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_4c0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_4b8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_4b0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_4a8;
  size_type local_4a0;
  uchar *local_498;
  uchar *local_490;
  size_type local_488;
  uchar *local_480;
  uchar *local_478;
  size_type local_470;
  undefined1 *local_468;
  size_type local_460;
  uchar *local_458;
  size_type local_450;
  size_type local_448;
  int local_43c;
  allocator_type *local_438;
  allocator_type *local_430;
  allocator_type *local_428;
  CfdException *local_420;
  allocator *local_418;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_410;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_408;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_400;
  uchar *local_3f8;
  size_type local_3f0;
  uchar *local_3e8;
  size_type local_3e0;
  uchar *local_3d8;
  int local_3cc;
  allocator_type *local_3c8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_3c0;
  uchar *local_3b8;
  allocator_type *local_3b0;
  undefined1 local_3a1;
  UnblindParameter *local_3a0;
  UnblindParameter *local_398;
  ByteData *local_390;
  int64_t local_388;
  undefined1 local_380;
  Amount local_378;
  ConfidentialValue local_368;
  ByteData256 local_340;
  BlindFactor local_328;
  ByteData256 local_308;
  BlindFactor local_2f0;
  ByteData local_2d0;
  ConfidentialAssetId local_2b8;
  undefined1 local_28b;
  undefined1 local_28a;
  allocator local_289;
  string local_288;
  CfdSourceLocation local_268;
  int64_t local_250;
  uint64_t value_out;
  undefined1 local_240 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> asset_out;
  undefined1 local_220 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> vbf_out;
  undefined1 local_200 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> abf_out;
  string local_1e0;
  CfdSourceLocation local_1c0;
  allocator<unsigned_char> local_1a1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1a0 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> generator;
  undefined1 local_170 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> asset_bytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_150 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> empty_factor;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_120;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_108 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> extra_bytes;
  undefined1 local_d8 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> commitment_bytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> rangeproof_bytes;
  ByteData local_98;
  undefined1 local_80 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> nonce_bytes;
  int ret;
  ConfidentialAssetId *asset_local;
  Script *extra_local;
  ConfidentialValue *value_commitment_local;
  ByteData *rangeproof_local;
  Privkey *blinding_key_local;
  UnblindParameter *result;
  
  local_390 = &local_98;
  local_3a0 = __return_storage_ptr__;
  local_398 = __return_storage_ptr__;
  Privkey::GetData(local_390,blinding_key);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_80,local_390);
  ByteData::~ByteData(&local_98);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     &commitment_bytes.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,rangeproof);
  ConfidentialValue::GetData
            ((ByteData *)
             &extra_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,value_commitment);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d8,
                     (ByteData *)
                     &extra_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  ByteData::~ByteData((ByteData *)
                      &extra_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(local_108);
  local_3a1 = Script::IsEmpty(extra);
  if (!(bool)local_3a1) {
    Script::GetData((ByteData *)
                    &empty_factor.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,extra);
    ByteData::GetBytes(&local_120,
                       (ByteData *)
                       &empty_factor.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(local_108,&local_120);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_120);
    ByteData::~ByteData((ByteData *)
                        &empty_factor.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
  }
  local_3b0 = (allocator_type *)
              ((long)&asset_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  ::std::allocator<unsigned_char>::allocator(local_3b0);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(local_150,0x20,local_3b0);
  ::std::allocator<unsigned_char>::~allocator
            ((allocator<unsigned_char> *)
             ((long)&asset_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  local_3c0 = local_150;
  local_3b8 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_3c0);
  sVar1 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_3c0);
  memset(local_3b8,0,sVar1);
  ConfidentialAssetId::GetUnblindedData
            ((ByteData *)
             &generator.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,asset);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_170,
                     (ByteData *)
                     &generator.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  ByteData::~ByteData((ByteData *)
                      &generator.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
  local_3c8 = &local_1a1;
  ::std::allocator<unsigned_char>::allocator(local_3c8);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(local_1a0,0x21,local_3c8);
  ::std::allocator<unsigned_char>::~allocator(&local_1a1);
  local_410 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_170;
  local_3f8 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_410);
  local_3f0 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_410);
  local_408 = local_150;
  local_3e8 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_408);
  local_3e0 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_408);
  local_400 = local_1a0;
  local_3d8 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_400);
  sVar1 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_400);
  local_3cc = wally_asset_generator_from_bytes
                        (local_3f8,local_3f0,local_3e8,local_3e0,local_3d8,sVar1);
  nonce_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = local_3cc;
  if (local_3cc == 0) {
    local_428 = (allocator_type *)
                ((long)&vbf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
    ::std::allocator<unsigned_char>::allocator(local_428);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_200,0x20,local_428);
    ::std::allocator<unsigned_char>::~allocator
              ((allocator<unsigned_char> *)
               ((long)&vbf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    local_430 = (allocator_type *)
                ((long)&asset_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
    ::std::allocator<unsigned_char>::allocator(local_430);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_220,0x20,local_430);
    ::std::allocator<unsigned_char>::~allocator
              ((allocator<unsigned_char> *)
               ((long)&asset_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    local_438 = (allocator_type *)((long)&value_out + 7);
    ::std::allocator<unsigned_char>::allocator(local_438);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_240,0x20,local_438);
    ::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)((long)&value_out + 7));
    local_250 = 0;
    local_4e0 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_80;
    local_490 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_4e0);
    local_488 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_4e0);
    local_4d8 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                &commitment_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_480 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_4d8);
    local_448 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_4d8);
    local_4d0 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d8;
    local_478 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_4d0);
    local_470 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_4d0);
    local_4c8 = local_108;
    local_498 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_4c8);
    local_4a0 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_4c8);
    local_4c0 = local_1a0;
    puVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_4c0);
    sVar1 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_4c0);
    local_4b8 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_240;
    puVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_4b8);
    sVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_4b8);
    local_4b0 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_200;
    puVar5 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_4b0);
    local_450 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_4b0);
    local_4a8 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_220;
    local_458 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_4a8);
    local_510 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_4a8);
    local_508 = &local_250;
    local_518 = local_458;
    local_520 = local_450;
    local_550 = local_4a0;
    local_558 = local_498;
    local_548 = puVar2;
    local_540 = sVar1;
    local_538 = puVar3;
    local_530 = sVar4;
    local_528 = puVar5;
    local_468 = (undefined1 *)&local_558;
    local_460 = local_510;
    local_43c = wally_asset_unblind_with_nonce
                          (local_490,local_488,local_480,local_448,local_478,local_470);
    nonce_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = local_43c;
    if (local_43c == 0) {
      local_28b = 0;
      UnblindParameter::UnblindParameter(local_3a0);
      ByteData::ByteData(&local_2d0,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_240);
      ConfidentialAssetId::ConfidentialAssetId(&local_2b8,&local_2d0);
      ConfidentialAssetId::operator=(&local_3a0->asset,&local_2b8);
      ConfidentialAssetId::~ConfidentialAssetId(&local_2b8);
      ByteData::~ByteData(&local_2d0);
      ByteData256::ByteData256
                (&local_308,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_200);
      BlindFactor::BlindFactor(&local_2f0,&local_308);
      BlindFactor::operator=(&local_3a0->abf,&local_2f0);
      BlindFactor::~BlindFactor(&local_2f0);
      ByteData256::~ByteData256(&local_308);
      ByteData256::ByteData256
                (&local_340,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_220);
      BlindFactor::BlindFactor(&local_328,&local_340);
      BlindFactor::operator=(&local_3a0->vbf,&local_328);
      BlindFactor::~BlindFactor(&local_328);
      ByteData256::~ByteData256(&local_340);
      AVar6 = Amount::CreateBySatoshiAmount(local_250);
      local_4f8 = AVar6.amount_;
      local_4f9 = AVar6.ignore_check_;
      local_388 = local_4f8;
      local_380 = local_4f9;
      local_378.amount_ = local_4f8;
      local_378.ignore_check_ = (bool)local_4f9;
      ConfidentialValue::ConfidentialValue(&local_368,&local_378);
      ConfidentialValue::operator=(&local_3a0->value,&local_368);
      ConfidentialValue::~ConfidentialValue(&local_368);
      local_28b = 1;
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_240);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_220);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_200);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(local_1a0);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_170);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(local_150);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(local_108);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d8);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &commitment_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_80);
      return local_398;
    }
    local_268.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                 ,0x2f);
    local_268.filename = local_268.filename + 1;
    local_268.line = 0xbcd;
    local_268.funcname = "CalculateUnblindIssueData";
    logger::warn<int&>(&local_268,"wally_asset_unblind_with_nonce NG[{}].",
                       (int *)((long)&nonce_bytes.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    local_28a = 1;
    local_4f0 = (CfdException *)__cxa_allocate_exception(0x30);
    local_4e8 = &local_289;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_288,"unblind confidential data error.",local_4e8);
    CfdException::CfdException(local_4f0,kCfdIllegalStateError,&local_288);
    local_28a = 0;
    __cxa_throw(local_4f0,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_1c0.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_elements_transaction.cpp"
               ,0x2f);
  local_1c0.filename = local_1c0.filename + 1;
  local_1c0.line = 0xbbd;
  local_1c0.funcname = "CalculateUnblindIssueData";
  logger::warn<int&>(&local_1c0,"wally_asset_generator_from_bytes NG[{}].",
                     (int *)((long)&nonce_bytes.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  abf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
  local_420 = (CfdException *)__cxa_allocate_exception(0x30);
  local_418 = (allocator *)
              ((long)&abf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_1e0,"asset generator error.",local_418);
  CfdException::CfdException(local_420,kCfdIllegalStateError,&local_1e0);
  abf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
  __cxa_throw(local_420,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

UnblindParameter ConfidentialTransaction::CalculateUnblindIssueData(
    const Privkey &blinding_key, const ByteData &rangeproof,
    const ConfidentialValue &value_commitment, const Script &extra,
    const ConfidentialAssetId &asset) {
  int ret;
  const std::vector<uint8_t> nonce_bytes = blinding_key.GetData().GetBytes();
  const std::vector<uint8_t> rangeproof_bytes = rangeproof.GetBytes();
  const std::vector<uint8_t> commitment_bytes =
      value_commitment.GetData().GetBytes();
  std::vector<uint8_t> extra_bytes;
  if (!extra.IsEmpty()) {
    extra_bytes = extra.GetData().GetBytes();
  }

  std::vector<uint8_t> empty_factor(kBlindFactorSize);
  memset(empty_factor.data(), 0, empty_factor.size());
  const std::vector<uint8_t> asset_bytes = asset.GetUnblindedData().GetBytes();
  std::vector<uint8_t> generator(ASSET_GENERATOR_LEN);
  ret = wally_asset_generator_from_bytes(
      asset_bytes.data(), asset_bytes.size(), empty_factor.data(),
      empty_factor.size(), generator.data(), generator.size());
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_asset_generator_from_bytes NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "asset generator error.");
  }

  std::vector<uint8_t> abf_out(kBlindFactorSize);
  std::vector<uint8_t> vbf_out(kBlindFactorSize);
  std::vector<uint8_t> asset_out(kAssetSize);
  uint64_t value_out = 0;
  ret = wally_asset_unblind_with_nonce(
      nonce_bytes.data(), nonce_bytes.size(), rangeproof_bytes.data(),
      rangeproof_bytes.size(), commitment_bytes.data(),
      commitment_bytes.size(), extra_bytes.data(), extra_bytes.size(),
      generator.data(), generator.size(), asset_out.data(), asset_out.size(),
      abf_out.data(), abf_out.size(), vbf_out.data(), vbf_out.size(),
      &value_out);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_asset_unblind_with_nonce NG[{}].", ret);
    throw CfdException(
        kCfdIllegalStateError, "unblind confidential data error.");
  }

  UnblindParameter result;
  result.asset = ConfidentialAssetId(asset_out);
  result.abf = BlindFactor(ByteData256(abf_out));
  result.vbf = BlindFactor(ByteData256(vbf_out));
  result.value = ConfidentialValue(Amount::CreateBySatoshiAmount(value_out));
  return result;
}